

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall
xray_re::cse_alife_creature_actor::state_read
          (cse_alife_creature_actor *this,xr_packet *packet,uint16_t size)

{
  ushort version;
  
  if (*(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28 < 0x15) {
    xr_packet::r_raw(packet,&(this->super_cse_alife_creature_abstract).m_s_team,1);
    xr_packet::r_raw(packet,&(this->super_cse_alife_creature_abstract).m_s_squad,1);
    xr_packet::r_raw(packet,&(this->super_cse_alife_creature_abstract).m_s_group,1);
    version = *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28;
    if (0x12 < version) {
      xr_packet::r_raw(packet,&(this->super_cse_alife_creature_abstract).m_health,4);
      version = *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28;
    }
    if (2 < version) goto LAB_00153eaa;
  }
  else {
    cse_alife_creature_abstract::state_read(&this->super_cse_alife_creature_abstract,packet,0);
    cse_alife_trader_abstract::state_read(&this->super_cse_alife_trader_abstract,packet,0);
    version = *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28;
    if (0x1f < version) goto LAB_00153ec1;
LAB_00153eaa:
    cse_visual::visual_read
              ((cse_visual *)&(this->super_cse_alife_creature_abstract).field_0x118,packet,version);
  }
  version = *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28;
LAB_00153ec1:
  if (0x5b < version) {
    cse_ph_skeleton::state_read(&this->super_cse_ph_skeleton,packet,0);
    version = *(ushort *)&(this->super_cse_alife_creature_abstract).field_0x28;
  }
  if (version < 0x59) {
    return;
  }
  xr_packet::r_raw(packet,&this->m_holder_id,2);
  return;
}

Assistant:

void cse_alife_creature_actor::state_read(xr_packet& packet, uint16_t size)
{
	if (m_version < CSE_VERSION_0x15) {
		packet.r_u8(m_s_team);
		packet.r_u8(m_s_squad);
		packet.r_u8(m_s_group);
		if (m_version > CSE_VERSION_0x12)
			packet.r_float(m_health);
		if (m_version >= CSE_VERSION_0x03)
			cse_visual::visual_read(packet, m_version);
	} else {
		cse_alife_creature_abstract::state_read(packet, size);
		cse_alife_trader_abstract::state_read(packet, size);
		if (m_version < CSE_VERSION_0x20)
			cse_visual::visual_read(packet, m_version);
	}
	if (m_version > CSE_VERSION_0x5b)
		cse_ph_skeleton::state_read(packet, size);
	if (m_version > CSE_VERSION_0x58)
		packet.r_u16(m_holder_id);
}